

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cc
# Opt level: O1

void __thiscall Minisat::Solver::info_based_rephase(Solver *this)

{
  uint *puVar1;
  int iVar2;
  uint uVar3;
  double *pdVar4;
  Heap<Minisat::Solver::VarOrderLt> *this_00;
  undefined1 auVar5 [16];
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  int i;
  double dVar10;
  
  iVar2 = (this->vardata).sz;
  lVar9 = (long)iVar2;
  if (0 < lVar9) {
    lVar6 = 0;
    do {
      (this->polarity).data[lVar6] =
           (this->ls_mediation_soln).super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[lVar6] == '\0';
      lVar6 = lVar6 + 1;
    } while (lVar9 != lVar6);
  }
  if ((((this->current_heuristic & ~CHB) != VSIDS_DISTANCE) &&
      ((this->ccnr).conflict_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_finish !=
       (this->ccnr).conflict_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
       super__Vector_impl_data._M_start)) && (0 < iVar2 && 0 < (this->ccnr)._step)) {
    lVar6 = 0;
    do {
      uVar3 = (this->ccnr).conflict_ct.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar6 + 1];
      if (0 < (int)uVar3) {
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (ulong)uVar3 * 100;
        lVar7 = SUB168(auVar5 / SEXT816((this->ccnr)._step),0);
        if (this->current_heuristic < CHB) {
          pdVar4 = (this->activity_VSIDS).data;
          dVar10 = (double)lVar7 * this->var_inc + pdVar4[lVar6];
          pdVar4[lVar6] = dVar10;
          if (1e+100 < dVar10) {
            lVar7 = (long)(this->vardata).sz;
            if (0 < lVar7) {
              lVar8 = 0;
              do {
                pdVar4[lVar8] = pdVar4[lVar8] * 1e-100;
                lVar8 = lVar8 + 1;
              } while (lVar7 != lVar8);
            }
            this->var_inc = this->var_inc * 1e-100;
          }
          this_00 = this->order_heap;
          if ((lVar6 < (this_00->indices).sz) &&
             (iVar2 = (this_00->indices).data[lVar6], -1 < iVar2)) {
            Heap<Minisat::Solver::VarOrderLt>::percolateUp(this_00,iVar2);
          }
        }
        else {
          if (lVar7 < 2) {
            lVar7 = 1;
          }
          puVar1 = (this->conflicted).data + lVar6;
          *puVar1 = *puVar1 + (int)lVar7;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != lVar9);
  }
  return;
}

Assistant:

void Solver::info_based_rephase()
{
    int var_nums = nVars();
    for (int i = 0; i < var_nums; ++i) polarity[i] = !ls_mediation_soln[i];
    if (!considersDISTANCE() && ccnr.conflict_ct.size() > 0 && ccnr._step > 0) {
        for (int i = 0; i < var_nums; ++i) {
            if (ccnr.conflict_ct[i + 1] > 0) {
                if (usesVSIDS()) {
                    varBumpActivity(i, ccnr.conflict_ct[i + 1] * 100 / ccnr._step);
                } else {
                    conflicted[i] += std::max((long long int)1, ccnr.conflict_ct[i + 1] * 100 / ccnr._step);
                }
            }
        }
    }
}